

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O0

void __thiscall
PosTagger_TestUserDict_Test::~PosTagger_TestUserDict_Test(PosTagger_TestUserDict_Test *this)

{
  void *in_RDI;
  
  ~PosTagger_TestUserDict_Test((PosTagger_TestUserDict_Test *)0x1d1fc8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(PosTagger, TestUserDict) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8", "../test/testdata/userdict.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST2, res);
    string s;
    s << res;
    ASSERT_EQ(s, ANS_TEST2);
  }
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST3, res);
    string s;
    s << res;
    ASSERT_EQ(s, ANS_TEST3);
  }
}